

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O2

void av1_filter_block_plane_vert_opt_chroma
               (AV1_COMMON *cm,MACROBLOCKD *xd,MACROBLOCKD_PLANE *plane_ptr,uint32_t mi_row,
               uint32_t mi_col,AV1_DEBLOCKING_PARAMETERS *params_buf,TX_SIZE *tx_buf,int plane,
               _Bool joint_filter_chroma,int num_mis_in_lpf_unit_height_log2)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  loop_filter_info_n *lfi_n;
  BLOCK_SIZE BVar3;
  uint subsampling_x;
  uint subsampling_y;
  aom_bit_depth_t bd;
  MB_MODE_INFO *pMVar4;
  MB_MODE_INFO **ppMVar5;
  loop_filter_thresh *_blimit0;
  bool bVar6;
  uint16_t *s;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  byte bVar12;
  byte bVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  uint8_t *puVar19;
  int iVar20;
  uint8_t *dst_ptr;
  uint8_t *puVar21;
  uint uVar22;
  uint uVar23;
  byte bVar24;
  uint16_t *s_00;
  AV1_DEBLOCKING_PARAMETERS *pAVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  byte *pbVar30;
  uint32_t uVar31;
  MB_MODE_INFO *pMVar32;
  byte *local_b8;
  
  subsampling_x = plane_ptr->subsampling_x;
  subsampling_y = plane_ptr->subsampling_y;
  bVar12 = (byte)subsampling_x;
  bVar13 = (byte)subsampling_y;
  iVar26 = (((1 << (bVar13 & 0x1f)) >> 1) + (((plane_ptr->dst).height << (bVar13 & 0x1f)) + 3 >> 2)
           >> (bVar13 & 0x1f)) - (mi_row >> (bVar13 & 0x1f));
  iVar20 = (1 << ((byte)num_mis_in_lpf_unit_height_log2 & 0x1f)) >> (bVar13 & 0x1f);
  if (iVar26 < iVar20) {
    iVar20 = iVar26;
  }
  uVar15 = (((1 << (bVar12 & 0x1f)) >> 1) + (((plane_ptr->dst).width << (bVar12 & 0x1f)) + 3 >> 2)
           >> (bVar12 & 0x1f)) - (mi_col >> (bVar12 & 0x1f));
  uVar10 = 0x20 >> (bVar12 & 0x1f);
  if ((int)uVar15 < (int)uVar10) {
    uVar10 = uVar15;
  }
  lVar16 = -1L << (bVar12 & 0x3f);
  iVar26 = (plane_ptr->dst).stride;
  lVar17 = (long)iVar26;
  uVar22 = subsampling_x | mi_col;
  lfi_n = &cm->lf_info;
  uVar15 = 0;
  do {
    if (iVar20 <= (int)uVar15) {
      return;
    }
    params_buf->filter_length = '\0';
    uVar23 = (uVar15 << (bVar13 & 0x1f)) + mi_row | subsampling_y;
    ppMVar5 = (cm->mi_params).mi_grid_base +
              (ulong)((cm->mi_params).mi_stride * uVar23) + (ulong)uVar22;
    pMVar4 = *ppMVar5;
    if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar4->field_0xa7 & 7] == 0)) {
      if (plane == 0) {
        bVar8 = pMVar4->tx_size;
        if ((((pMVar4->field_0xa7 & 0x80) != 0) || ('\0' < pMVar4->ref_frame[0])) &&
           (pMVar4->skip_txfm == '\0')) {
          BVar3 = pMVar4->bsize;
          bVar8 = pMVar4->inter_tx_size
                  [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                          [BVar3] - 1 & uVar22) >>
                   (av1_get_txb_size_index_tw_w_log2_table[BVar3] & 0x1f)) +
                   (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                           [BVar3] - 1 & uVar23) >>
                    (av1_get_txb_size_index_tw_h_log2_table[BVar3] & 0x1f)) <<
                   (av1_get_txb_size_index_stride_log2_table[BVar3] & 0x1f))];
        }
      }
      else {
        bVar8 = av1_get_max_uv_txsize(pMVar4->bsize,subsampling_x,subsampling_y);
      }
      *tx_buf = bVar8;
      if (mi_col != 0) {
        pMVar32 = ppMVar5[lVar16];
        if (xd != (MACROBLOCKD *)0x0) goto LAB_0031f424;
LAB_0031f440:
        if (plane == 0) {
          bVar9 = pMVar32->tx_size;
          if ((((pMVar32->field_0xa7 & 0x80) != 0) || ('\0' < pMVar32->ref_frame[0])) &&
             (pMVar32->skip_txfm == '\0')) {
            BVar3 = pMVar32->bsize;
            bVar9 = pMVar32->inter_tx_size
                    [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                            [BVar3] - 1 & (-1 << (bVar12 & 0x1f)) + uVar22) >>
                     (av1_get_txb_size_index_tw_w_log2_table[BVar3] & 0x1f)) +
                     (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                             [BVar3] - 1 & uVar23) >>
                      (av1_get_txb_size_index_tw_h_log2_table[BVar3] & 0x1f)) <<
                     (av1_get_txb_size_index_stride_log2_table[BVar3] & 0x1f))];
          }
        }
        else {
          bVar9 = av1_get_max_uv_txsize(pMVar32->bsize,subsampling_x,subsampling_y);
        }
        goto LAB_0031f4ed;
      }
LAB_0031f469:
      iVar28 = 0x40;
      bVar24 = bVar8;
    }
    else {
      *tx_buf = '\0';
      if (mi_col == 0) {
        bVar8 = 0;
        goto LAB_0031f469;
      }
      pMVar32 = ppMVar5[lVar16];
      bVar8 = 0;
LAB_0031f424:
      if (xd->lossless[*(ushort *)&pMVar32->field_0xa7 & 7] == 0) goto LAB_0031f440;
      bVar9 = 0;
LAB_0031f4ed:
      iVar28 = tx_size_high[bVar9];
      bVar7 = get_filter_level(cm,lfi_n,0,plane,pMVar4);
      if (bVar7 == 0) {
        bVar7 = get_filter_level(cm,lfi_n,0,plane,pMVar32);
      }
      bVar6 = true;
      if ((pMVar32 == pMVar4) && (pMVar4->skip_txfm != '\0')) {
        if ((pMVar4->field_0xa7 & 0x80) == 0) {
          bVar6 = pMVar4->ref_frame[0] < '\x01';
        }
        else {
          bVar6 = false;
        }
      }
      bVar24 = bVar8;
      if ((!(bool)(pMVar32 == pMVar4 & (bVar6 ^ 1U))) && (bVar7 != 0)) {
        params_buf->filter_length = (uint8_t)vert_filter_length_chroma[bVar8][bVar9];
        params_buf->lfthr = lfi_n->lfthr + bVar7;
        bVar24 = *tx_buf;
      }
    }
    iVar11 = tx_size_high[bVar8];
    if (iVar28 < tx_size_high[bVar8]) {
      iVar11 = iVar28;
    }
    uVar14 = (ulong)bVar24;
    local_b8 = tx_buf;
    pAVar25 = params_buf;
    uVar31 = mi_col;
    while( true ) {
      iVar28 = tx_size_wide_unit[uVar14];
      uVar31 = (iVar28 << (bVar12 & 0x1f)) + uVar31;
      if ((uVar10 << (bVar12 & 0x1f)) + mi_col <= uVar31) break;
      pAVar25 = pAVar25 + iVar28;
      pAVar25->filter_length = '\0';
      uVar27 = uVar31 | subsampling_x;
      uVar29 = (cm->mi_params).mi_stride * uVar23;
      ppMVar5 = (cm->mi_params).mi_grid_base;
      pMVar4 = ppMVar5[(ulong)uVar29 + (ulong)uVar27];
      if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar4->field_0xa7 & 7] == 0)) {
        if (plane == 0) {
          bVar8 = pMVar4->tx_size;
          if ((((pMVar4->field_0xa7 & 0x80) != 0) || ('\0' < pMVar4->ref_frame[0])) &&
             (pMVar4->skip_txfm == '\0')) {
            BVar3 = pMVar4->bsize;
            bVar8 = pMVar4->inter_tx_size
                    [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                            [BVar3] - 1 & uVar27) >>
                     (av1_get_txb_size_index_tw_w_log2_table[BVar3] & 0x1f)) +
                     (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                             [BVar3] - 1 & uVar23) >>
                      (av1_get_txb_size_index_tw_h_log2_table[BVar3] & 0x1f)) <<
                     (av1_get_txb_size_index_stride_log2_table[BVar3] & 0x1f))];
          }
        }
        else {
          bVar8 = av1_get_max_uv_txsize(pMVar4->bsize,subsampling_x,subsampling_y);
        }
      }
      else {
        bVar8 = 0;
      }
      local_b8 = local_b8 + iVar28;
      *local_b8 = bVar8;
      pMVar32 = ppMVar5[(ulong)uVar29 + (ulong)uVar27 + lVar16];
      bVar9 = get_filter_level(cm,lfi_n,0,plane,pMVar4);
      if (bVar9 == 0) {
        bVar9 = get_filter_level(cm,lfi_n,0,plane,pMVar32);
      }
      bVar6 = true;
      if ((pMVar32 == pMVar4) && (pMVar4->skip_txfm != '\0')) {
        if ((pMVar4->field_0xa7 & 0x80) == 0) {
          bVar6 = pMVar4->ref_frame[0] < '\x01';
        }
        else {
          bVar6 = false;
        }
      }
      uVar18 = (ulong)bVar8;
      uVar14 = uVar18;
      if ((bool)(bVar9 != 0 & (pMVar32 != pMVar4 | bVar6))) {
        pAVar25->filter_length = (uint8_t)vert_filter_length_chroma[uVar18][bVar24];
        pAVar25->lfthr = lfi_n->lfthr + bVar9;
        uVar14 = (ulong)*local_b8;
        bVar8 = *local_b8;
      }
      bVar24 = bVar8;
      if (tx_size_high[uVar18] <= iVar11) {
        iVar11 = tx_size_high[uVar18];
      }
    }
    if (((uVar15 & 3) == 0) && ((int)(uVar15 | 3) < iVar20)) {
      local_b8._0_1_ = '\x02';
      uVar23 = 3;
      if (iVar11 < 0x10) goto LAB_0031f7f8;
    }
    else {
LAB_0031f7f8:
      uVar23 = 0;
      local_b8._0_1_ = '\0';
      if ((uVar15 & 1) == 0) {
        local_b8._0_1_ = 7 < iVar11 && (int)(uVar15 | 1) < iVar20;
        uVar23 = (uint)(USE_FILTER_TYPE)local_b8;
      }
    }
    pAVar25 = params_buf;
    pbVar30 = tx_buf;
    for (iVar28 = 0; iVar28 < (int)uVar10; iVar28 = iVar28 + uVar27) {
      if (*pbVar30 == 0xff) {
        pAVar25->filter_length = '\0';
        *pbVar30 = 0;
      }
      iVar11 = iVar26 * 4 * uVar15 + iVar28 * 4;
      puVar21 = (plane_ptr->dst).buf + iVar11;
      if (joint_filter_chroma) {
        _blimit0 = pAVar25->lfthr;
        puVar19 = plane_ptr[1].dst.buf + iVar11;
        if (cm->seq_params->use_highbitdepth == '\0') {
          uVar27 = pAVar25->filter_length - 4;
          uVar27 = uVar27 >> 1 | (uint)((uVar27 & 1) != 0) << 0x1f;
          if ((USE_FILTER_TYPE)local_b8 == '\x01') {
            if (uVar27 == 1) {
              puVar1 = _blimit0->lim;
              puVar2 = _blimit0->hev_thr;
              aom_lpf_vertical_6_dual_sse2
                        (puVar21,iVar26,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,puVar2)
              ;
              aom_lpf_vertical_6_dual_sse2
                        (puVar19,iVar26,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,puVar2)
              ;
            }
            else if (uVar27 == 0) {
              puVar1 = _blimit0->lim;
              puVar2 = _blimit0->hev_thr;
              aom_lpf_vertical_4_dual_sse2
                        (puVar21,iVar26,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,puVar2)
              ;
              aom_lpf_vertical_4_dual_sse2
                        (puVar19,iVar26,_blimit0->mblim,puVar1,puVar2,_blimit0->mblim,puVar1,puVar2)
              ;
            }
          }
          else if ((USE_FILTER_TYPE)local_b8 == '\x02') {
            if (uVar27 == 1) {
              aom_lpf_vertical_6_quad_sse2
                        (puVar21,iVar26,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
              aom_lpf_vertical_6_quad_sse2
                        (puVar19,iVar26,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
            }
            else if (uVar27 == 0) {
              aom_lpf_vertical_4_quad_sse2
                        (puVar21,iVar26,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
              aom_lpf_vertical_4_quad_sse2
                        (puVar19,iVar26,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
            }
          }
          else if (uVar27 == 1) {
            aom_lpf_vertical_6_sse2(puVar21,iVar26,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
            aom_lpf_vertical_6_sse2(puVar19,iVar26,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
          }
          else if (uVar27 == 0) {
            aom_lpf_vertical_4_sse2(puVar21,iVar26,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
            aom_lpf_vertical_4_sse2(puVar19,iVar26,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr);
          }
        }
        else {
          bd = cm->seq_params->bit_depth;
          s = (uint16_t *)((long)puVar21 * 2);
          s_00 = (uint16_t *)((long)puVar19 * 2);
          uVar27 = pAVar25->filter_length - 4;
          uVar27 = uVar27 >> 1 | (uint)((uVar27 & 1) != 0) << 0x1f;
          if ((USE_FILTER_TYPE)local_b8 == '\x01') {
            if (uVar27 == 1) {
              aom_highbd_lpf_vertical_6_dual_sse2
                        (s,iVar26,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,_blimit0->mblim,
                         _blimit0->lim,_blimit0->hev_thr,bd);
LAB_0031fd2c:
              aom_highbd_lpf_vertical_6_dual_sse2
                        (s_00,iVar26,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,_blimit0->mblim
                         ,_blimit0->lim,_blimit0->hev_thr,bd);
            }
            else if (uVar27 == 0) {
              (*aom_highbd_lpf_vertical_4_dual)
                        (s,iVar26,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,_blimit0->mblim,
                         _blimit0->lim,_blimit0->hev_thr,bd);
LAB_0031fae6:
              (*aom_highbd_lpf_vertical_4_dual)
                        (s_00,iVar26,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,_blimit0->mblim
                         ,_blimit0->lim,_blimit0->hev_thr,bd);
            }
          }
          else if ((USE_FILTER_TYPE)local_b8 == '\x02') {
            if (uVar27 == 1) {
              puVar21 = _blimit0->lim;
              puVar19 = _blimit0->hev_thr;
              aom_highbd_lpf_vertical_6_dual_sse2
                        (s,iVar26,_blimit0->mblim,puVar21,puVar19,_blimit0->mblim,puVar21,puVar19,bd
                        );
              aom_highbd_lpf_vertical_6_dual_sse2
                        (s + lVar17 * 8,iVar26,_blimit0->mblim,puVar21,puVar19,_blimit0->mblim,
                         puVar21,puVar19,bd);
              aom_highbd_lpf_vertical_6_dual_sse2
                        (s_00,iVar26,_blimit0->mblim,puVar21,puVar19,_blimit0->mblim,puVar21,puVar19
                         ,bd);
              s_00 = s_00 + lVar17 * 8;
              goto LAB_0031fd2c;
            }
            if (uVar27 == 0) {
              puVar21 = _blimit0->lim;
              puVar19 = _blimit0->hev_thr;
              (*aom_highbd_lpf_vertical_4_dual)
                        (s,iVar26,_blimit0->mblim,puVar21,puVar19,_blimit0->mblim,puVar21,puVar19,bd
                        );
              (*aom_highbd_lpf_vertical_4_dual)
                        (s + lVar17 * 8,iVar26,_blimit0->mblim,puVar21,puVar19,_blimit0->mblim,
                         puVar21,puVar19,bd);
              (*aom_highbd_lpf_vertical_4_dual)
                        (s_00,iVar26,_blimit0->mblim,puVar21,puVar19,_blimit0->mblim,puVar21,puVar19
                         ,bd);
              s_00 = s_00 + lVar17 * 8;
              goto LAB_0031fae6;
            }
          }
          else if (uVar27 == 1) {
            aom_highbd_lpf_vertical_6_sse2
                      (s,iVar26,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
            aom_highbd_lpf_vertical_6_sse2
                      (s_00,iVar26,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
          }
          else if (uVar27 == 0) {
            aom_highbd_lpf_vertical_4_sse2
                      (s,iVar26,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
            aom_highbd_lpf_vertical_4_sse2
                      (s_00,iVar26,_blimit0->mblim,_blimit0->lim,_blimit0->hev_thr,bd);
          }
        }
      }
      else {
        filter_vert(puVar21,iVar26,pAVar25,cm->seq_params,(USE_FILTER_TYPE)local_b8);
      }
      uVar27 = tx_size_wide_unit[*pbVar30];
      pbVar30 = pbVar30 + uVar27;
      pAVar25 = pAVar25 + uVar27;
    }
    uVar15 = uVar15 + uVar23 + 1;
  } while( true );
}

Assistant:

void av1_filter_block_plane_vert_opt_chroma(
    const AV1_COMMON *const cm, const MACROBLOCKD *const xd,
    const MACROBLOCKD_PLANE *const plane_ptr, const uint32_t mi_row,
    const uint32_t mi_col, AV1_DEBLOCKING_PARAMETERS *params_buf,
    TX_SIZE *tx_buf, int plane, bool joint_filter_chroma,
    int num_mis_in_lpf_unit_height_log2) {
  const uint32_t scale_horz = plane_ptr->subsampling_x;
  const uint32_t scale_vert = plane_ptr->subsampling_y;
  const int dst_stride = plane_ptr->dst.stride;
  // Ensure that mi_cols/mi_rows are calculated based on frame dimension aligned
  // to MI_SIZE.
  const int mi_cols =
      ((plane_ptr->dst.width << scale_horz) + MI_SIZE - 1) >> MI_SIZE_LOG2;
  const int mi_rows =
      ((plane_ptr->dst.height << scale_vert) + MI_SIZE - 1) >> MI_SIZE_LOG2;
  const int plane_mi_rows = ROUND_POWER_OF_TWO(mi_rows, scale_vert);
  const int plane_mi_cols = ROUND_POWER_OF_TWO(mi_cols, scale_horz);
  const int y_range =
      AOMMIN((int)(plane_mi_rows - (mi_row >> scale_vert)),
             ((1 << num_mis_in_lpf_unit_height_log2) >> scale_vert));
  const int x_range = AOMMIN((int)(plane_mi_cols - (mi_col >> scale_horz)),
                             (MAX_MIB_SIZE >> scale_horz));
  const ptrdiff_t mode_step = (ptrdiff_t)1 << scale_horz;

  for (int y = 0; y < y_range; y++) {
    const uint32_t curr_y = mi_row + (y << scale_vert);
    const uint32_t x_start = mi_col + (0 << scale_horz);
    const uint32_t x_end = mi_col + (x_range << scale_horz);
    int min_height = tx_size_high[TX_64X64];
    set_lpf_parameters_for_line_chroma(params_buf, tx_buf, cm, xd, VERT_EDGE,
                                       x_start, curr_y, plane_ptr, x_end,
                                       mode_step, scale_horz, scale_vert,
                                       &min_height, plane, joint_filter_chroma);

    AV1_DEBLOCKING_PARAMETERS *params = params_buf;
    TX_SIZE *tx_size = tx_buf;
    int use_filter_type = USE_SINGLE;
    int y_inc = 0;

    if ((y & 3) == 0 && (y + 3) < y_range && min_height >= 16) {
      // If we are on a row which is a multiple of 4, and the minimum height is
      // 16 pixels, then the current and below 3 rows must contain the same tx
      // block. This is because dim 16 can only happen every unit of 4 mi's.
      use_filter_type = USE_QUAD;
      y_inc = 3;
    } else if (y % 2 == 0 && (y + 1) < y_range && min_height >= 8) {
      // If we are on an even row, and the minimum height is 8 pixels, then the
      // current and below rows must contain the same tx block. This is because
      // dim 4 can only happen every unit of 2**0, and 8 every unit of 2**1,
      // etc.
      use_filter_type = USE_DUAL;
      y_inc = 1;
    }

    for (int x = 0; x < x_range;) {
      // inner loop always filter vertical edges in a MI block. If MI size
      // is 8x8, it will filter the vertical edge aligned with a 8x8 block.
      // If 4x4 transform is used, it will then filter the internal edge
      //  aligned with a 4x4 block
      if (*tx_size == TX_INVALID) {
        params->filter_length = 0;
        *tx_size = TX_4X4;
      }

      const int offset = y * MI_SIZE * dst_stride + x * MI_SIZE;
      if (joint_filter_chroma) {
        uint8_t *u_dst = plane_ptr[0].dst.buf + offset;
        uint8_t *v_dst = plane_ptr[1].dst.buf + offset;
        filter_vert_chroma(u_dst, v_dst, dst_stride, params, cm->seq_params,
                           use_filter_type);
      } else {
        uint8_t *dst_ptr = plane_ptr->dst.buf + offset;
        filter_vert(dst_ptr, dst_stride, params, cm->seq_params,
                    use_filter_type);
      }

      // advance the destination pointer
      const uint32_t advance_units = tx_size_wide_unit[*tx_size];
      x += advance_units;
      params += advance_units;
      tx_size += advance_units;
    }
    y += y_inc;
  }
}